

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::UpdateClipRect(ImDrawList *this)

{
  int *piVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  float fVar12;
  int iVar13;
  ImVec4 *pIVar14;
  ImDrawCmd *pIVar15;
  ImGuiContext *pIVar16;
  long lVar17;
  int iVar18;
  ImDrawCmd *pIVar19;
  long lVar20;
  ImTextureID pvVar21;
  int iVar22;
  void *pvVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ImVec4 curr_clip_rect;
  
  pIVar16 = GImGui;
  lVar17 = (long)(this->_ClipRectStack).Size;
  pIVar14 = &GNullClipRect;
  if (lVar17 != 0) {
    pIVar14 = (this->_ClipRectStack).Data + lVar17 + -1;
  }
  uVar8 = pIVar14->x;
  uVar9 = pIVar14->y;
  uVar10 = pIVar14->z;
  uVar11 = pIVar14->w;
  uVar6 = (this->CmdBuffer).Size;
  lVar17 = (long)(int)uVar6;
  pIVar15 = (this->CmdBuffer).Data;
  if (pIVar15 + lVar17 + -1 != (ImDrawCmd *)0x0 && 0 < lVar17) {
    uVar7 = pIVar15[lVar17 + -1].ElemCount;
    curr_clip_rect.x._0_1_ = (char)uVar8;
    curr_clip_rect.x._1_1_ = (char)((uint)uVar8 >> 8);
    curr_clip_rect.x._2_1_ = (char)((uint)uVar8 >> 0x10);
    curr_clip_rect.x._3_1_ = (char)((uint)uVar8 >> 0x18);
    curr_clip_rect.y._0_1_ = (char)uVar9;
    curr_clip_rect.y._1_1_ = (char)((uint)uVar9 >> 8);
    curr_clip_rect.y._2_1_ = (char)((uint)uVar9 >> 0x10);
    curr_clip_rect.y._3_1_ = (char)((uint)uVar9 >> 0x18);
    curr_clip_rect.z._0_1_ = (char)uVar10;
    curr_clip_rect.z._1_1_ = (char)((uint)uVar10 >> 8);
    curr_clip_rect.z._2_1_ = (char)((uint)uVar10 >> 0x10);
    curr_clip_rect.z._3_1_ = (char)((uint)uVar10 >> 0x18);
    curr_clip_rect.w._0_1_ = (char)uVar11;
    curr_clip_rect.w._1_1_ = (char)((uint)uVar11 >> 8);
    curr_clip_rect.w._2_1_ = (char)((uint)uVar11 >> 0x10);
    curr_clip_rect.w._3_1_ = (char)((uint)uVar11 >> 0x18);
    if (((uVar7 == 0) ||
        (auVar24[0] = -(*(char *)&pIVar15[lVar17 + -1].ClipRect.x == curr_clip_rect.x._0_1_),
        auVar24[1] = -(*(char *)((long)&pIVar15[lVar17 + -1].ClipRect.x + 1) ==
                      curr_clip_rect.x._1_1_),
        auVar24[2] = -(*(char *)((long)&pIVar15[lVar17 + -1].ClipRect.x + 2) ==
                      curr_clip_rect.x._2_1_),
        auVar24[3] = -(*(char *)((long)&pIVar15[lVar17 + -1].ClipRect.x + 3) ==
                      curr_clip_rect.x._3_1_),
        auVar24[4] = -(*(char *)&pIVar15[lVar17 + -1].ClipRect.y == curr_clip_rect.y._0_1_),
        auVar24[5] = -(*(char *)((long)&pIVar15[lVar17 + -1].ClipRect.y + 1) ==
                      curr_clip_rect.y._1_1_),
        auVar24[6] = -(*(char *)((long)&pIVar15[lVar17 + -1].ClipRect.y + 2) ==
                      curr_clip_rect.y._2_1_),
        auVar24[7] = -(*(char *)((long)&pIVar15[lVar17 + -1].ClipRect.y + 3) ==
                      curr_clip_rect.y._3_1_),
        auVar24[8] = -(*(char *)&pIVar15[lVar17 + -1].ClipRect.z == curr_clip_rect.z._0_1_),
        auVar24[9] = -(*(char *)((long)&pIVar15[lVar17 + -1].ClipRect.z + 1) ==
                      curr_clip_rect.z._1_1_),
        auVar24[10] = -(*(char *)((long)&pIVar15[lVar17 + -1].ClipRect.z + 2) ==
                       curr_clip_rect.z._2_1_),
        auVar24[0xb] = -(*(char *)((long)&pIVar15[lVar17 + -1].ClipRect.z + 3) ==
                        curr_clip_rect.z._3_1_),
        auVar24[0xc] = -(*(char *)&pIVar15[lVar17 + -1].ClipRect.w == curr_clip_rect.w._0_1_),
        auVar24[0xd] = -(*(char *)((long)&pIVar15[lVar17 + -1].ClipRect.w + 1) ==
                        curr_clip_rect.w._1_1_),
        auVar24[0xe] = -(*(char *)((long)&pIVar15[lVar17 + -1].ClipRect.w + 2) ==
                        curr_clip_rect.w._2_1_),
        auVar24[0xf] = -(*(char *)((long)&pIVar15[lVar17 + -1].ClipRect.w + 3) ==
                        curr_clip_rect.w._3_1_),
        (ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe | (ushort)(auVar24[0xf] >> 7) << 0xf
                ) == 0xffff)) && (pIVar15[lVar17 + -1].UserCallback == (ImDrawCallback)0x0)) {
      if (((1 < uVar6) && (uVar7 == 0)) &&
         (auVar25[0] = -(*(char *)&pIVar15[lVar17 + -2].ClipRect.x == curr_clip_rect.x._0_1_),
         auVar25[1] = -(*(char *)((long)&pIVar15[lVar17 + -2].ClipRect.x + 1) ==
                       curr_clip_rect.x._1_1_),
         auVar25[2] = -(*(char *)((long)&pIVar15[lVar17 + -2].ClipRect.x + 2) ==
                       curr_clip_rect.x._2_1_),
         auVar25[3] = -(*(char *)((long)&pIVar15[lVar17 + -2].ClipRect.x + 3) ==
                       curr_clip_rect.x._3_1_),
         auVar25[4] = -(*(char *)&pIVar15[lVar17 + -2].ClipRect.y == curr_clip_rect.y._0_1_),
         auVar25[5] = -(*(char *)((long)&pIVar15[lVar17 + -2].ClipRect.y + 1) ==
                       curr_clip_rect.y._1_1_),
         auVar25[6] = -(*(char *)((long)&pIVar15[lVar17 + -2].ClipRect.y + 2) ==
                       curr_clip_rect.y._2_1_),
         auVar25[7] = -(*(char *)((long)&pIVar15[lVar17 + -2].ClipRect.y + 3) ==
                       curr_clip_rect.y._3_1_),
         auVar25[8] = -(*(char *)&pIVar15[lVar17 + -2].ClipRect.z == curr_clip_rect.z._0_1_),
         auVar25[9] = -(*(char *)((long)&pIVar15[lVar17 + -2].ClipRect.z + 1) ==
                       curr_clip_rect.z._1_1_),
         auVar25[10] = -(*(char *)((long)&pIVar15[lVar17 + -2].ClipRect.z + 2) ==
                        curr_clip_rect.z._2_1_),
         auVar25[0xb] = -(*(char *)((long)&pIVar15[lVar17 + -2].ClipRect.z + 3) ==
                         curr_clip_rect.z._3_1_),
         auVar25[0xc] = -(*(char *)&pIVar15[lVar17 + -2].ClipRect.w == curr_clip_rect.w._0_1_),
         auVar25[0xd] = -(*(char *)((long)&pIVar15[lVar17 + -2].ClipRect.w + 1) ==
                         curr_clip_rect.w._1_1_),
         auVar25[0xe] = -(*(char *)((long)&pIVar15[lVar17 + -2].ClipRect.w + 2) ==
                         curr_clip_rect.w._2_1_),
         auVar25[0xf] = -(*(char *)((long)&pIVar15[lVar17 + -2].ClipRect.w + 3) ==
                         curr_clip_rect.w._3_1_),
         (ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                 (ushort)(auVar25[0xf] >> 7) << 0xf) == 0xffff)) {
        lVar20 = (long)(this->_TextureIdStack).Size;
        if (lVar20 == 0) {
          pvVar21 = (ImTextureID)0x0;
        }
        else {
          pvVar21 = (this->_TextureIdStack).Data[lVar20 + -1];
        }
        if ((pIVar15[lVar17 + -2].TextureId == pvVar21) &&
           (pIVar15[lVar17 + -2].UserCallback == (ImDrawCallback)0x0)) {
          (this->CmdBuffer).Size = uVar6 - 1;
          return;
        }
      }
      fVar5 = pIVar14->y;
      fVar2 = pIVar14->z;
      fVar12 = pIVar14->w;
      pIVar15[lVar17 + -1].ClipRect.x = pIVar14->x;
      pIVar15[lVar17 + -1].ClipRect.y = fVar5;
      pIVar15[lVar17 + -1].ClipRect.z = fVar2;
      pIVar15[lVar17 + -1].ClipRect.w = fVar12;
      return;
    }
  }
  lVar17 = (long)(this->_ClipRectStack).Size;
  pIVar14 = &GNullClipRect;
  if (lVar17 != 0) {
    pIVar14 = (this->_ClipRectStack).Data + lVar17 + -1;
  }
  fVar5 = pIVar14->x;
  uVar3 = pIVar14->y;
  uVar4 = pIVar14->z;
  lVar17 = (long)(this->_TextureIdStack).Size;
  if (lVar17 == 0) {
    pvVar23 = (void *)0x0;
  }
  else {
    pvVar23 = (this->_TextureIdStack).Data[lVar17 + -1];
  }
  if (((float)uVar4 < fVar5) || (fVar2 = pIVar14->w, fVar2 < (float)uVar3)) {
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0xa8,"void ImDrawList::AddDrawCmd()");
  }
  iVar13 = (this->CmdBuffer).Size;
  if (iVar13 != (this->CmdBuffer).Capacity) {
    pIVar15 = (this->CmdBuffer).Data;
    goto LAB_0014c2d0;
  }
  if (iVar13 == 0) {
    iVar18 = 8;
  }
  else {
    iVar18 = iVar13 / 2 + iVar13;
  }
  iVar22 = iVar13 + 1;
  if (iVar13 + 1 < iVar18) {
    iVar22 = iVar18;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  pIVar15 = (ImDrawCmd *)(*(pIVar16->IO).MemAllocFn)((long)iVar22 * 0x30);
  pIVar19 = (this->CmdBuffer).Data;
  if (pIVar19 == (ImDrawCmd *)0x0) {
LAB_0014c2b3:
    pIVar19 = (ImDrawCmd *)0x0;
    pIVar16 = GImGui;
  }
  else {
    memcpy(pIVar15,pIVar19,(long)(this->CmdBuffer).Size * 0x30);
    pIVar16 = GImGui;
    pIVar19 = (this->CmdBuffer).Data;
    if (pIVar19 == (ImDrawCmd *)0x0) goto LAB_0014c2b3;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar16->IO).MemFreeFn)(pIVar19);
  (this->CmdBuffer).Data = pIVar15;
  (this->CmdBuffer).Capacity = iVar22;
  iVar13 = (this->CmdBuffer).Size;
LAB_0014c2d0:
  (this->CmdBuffer).Size = iVar13 + 1;
  pIVar15[iVar13].ElemCount = 0;
  pIVar15[iVar13].ClipRect.x = fVar5;
  pIVar15[iVar13].ClipRect.y = (float)uVar3;
  pIVar15[iVar13].ClipRect.z = (float)uVar4;
  pIVar15[iVar13].ClipRect.w = fVar2;
  pIVar15[iVar13].TextureId = pvVar23;
  pIVar15[iVar13].UserCallback = (ImDrawCallback)0x0;
  (&pIVar15[iVar13].UserCallback)[1] = (ImDrawCallback)0x0;
  return;
}

Assistant:

void ImDrawList::UpdateClipRect()
{
    // If current command is used with different settings we need to add a new command
    const ImVec4 curr_clip_rect = GetCurrentClipRect();
    ImDrawCmd* curr_cmd = CmdBuffer.Size > 0 ? &CmdBuffer.Data[CmdBuffer.Size-1] : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && memcmp(&curr_cmd->ClipRect, &curr_clip_rect, sizeof(ImVec4)) != 0) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (curr_cmd->ElemCount == 0 && prev_cmd && memcmp(&prev_cmd->ClipRect, &curr_clip_rect, sizeof(ImVec4)) == 0 && prev_cmd->TextureId == GetCurrentTextureId() && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->ClipRect = curr_clip_rect;
}